

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

int QFileSystemEngine::mkdir(char *__path,__mode_t __mode)

{
  bool bVar1;
  mode_t __mode_00;
  int iVar2;
  QFlags<QFileDevice::Permission> *pQVar3;
  int *piVar4;
  uint in_register_00000034;
  char *__path_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  undefined8 local_28;
  long local_20;
  
  local_28 = CONCAT44(in_register_00000034,__mode);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath((NativePath *)&local_48,(QFileSystemEntry *)__path);
  if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
    bVar1 = qIsFilenameBroken((QByteArray *)&local_48);
    if (!bVar1) {
      __mode_00 = 0x1ff;
      if ((in_register_00000034 & 1) != 0) {
        pQVar3 = std::
                 _Optional_base_impl<QFlags<QFileDevice::Permission>,_std::_Optional_base<QFlags<QFileDevice::Permission>,_true,_true>_>
                 ::_M_get((_Optional_base_impl<QFlags<QFileDevice::Permission>,_std::_Optional_base<QFlags<QFileDevice::Permission>,_true,_true>_>
                           *)&local_28);
        __mode_00 = QtPrivate::toMode_t((Permissions)
                                        (pQVar3->
                                        super_QFlagsStorageHelper<QFileDevice::Permission,_4>).
                                        super_QFlagsStorage<QFileDevice::Permission>.i);
      }
      removeTrailingSlashes((QByteArray *)&local_48);
      __path_00 = local_48.ptr;
      if (local_48.ptr == (char *)0x0) {
        __path_00 = "";
      }
      iVar2 = ::mkdir(__path_00,__mode_00);
      iVar2 = (int)CONCAT71((int7)((ulong)&local_48 >> 8),iVar2 == 0);
      goto LAB_00124580;
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  iVar2 = 0;
LAB_00124580:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::mkdir(const QFileSystemEntry &entry,
                              std::optional<QFile::Permissions> permissions)
{
    QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);

    mode_t mode = permissions ? QtPrivate::toMode_t(*permissions) : 0777;
    auto result = QT_MKDIR(removeTrailingSlashes(path), mode) == 0;
#if defined(Q_OS_VXWORKS)
    if (result)
        forceRequestedPermissionsOnVxWorks(path, mode);
#endif
    return result;
}